

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int http_sendfile(http_s *r,int fd,uintptr_t length,uintptr_t offset)

{
  uintptr_t offset_local;
  uintptr_t length_local;
  int fd_local;
  http_s *r_local;
  
  if ((r == (http_s *)0x0) || (((r->method == 0 && (r->status_str == 0)) && (r->status != 0)))) {
    close(fd);
    r_local._4_4_ = -1;
  }
  else {
    add_content_length(r,length);
    add_content_type(r);
    add_date(r);
    r_local._4_4_ = (**(code **)((long)(r->private_data).vtbl + 8))(r,fd,length,offset);
  }
  return r_local._4_4_;
}

Assistant:

int http_sendfile(http_s *r, int fd, uintptr_t length, uintptr_t offset) {
  if (HTTP_INVALID_HANDLE(r)) {
    close(fd);
    return -1;
  };
  add_content_length(r, length);
  add_content_type(r);
  add_date(r);
  return ((http_vtable_s *)r->private_data.vtbl)
      ->http_sendfile(r, fd, length, offset);
}